

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O2

bool runtest<char>(char *inifile,char *expectedfile,basic_ostream<char,_std::char_traits<char>_> *os
                  )

{
  __type _Var1;
  ostream *poVar2;
  _List_node_base *p_Var3;
  allocator<char> local_479;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> expected;
  allocator<char> local_458 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> actual;
  Ini<char> ini;
  ostringstream local_3c0 [16];
  ostream local_3b0 [376];
  basic_ifstream<char,_std::char_traits<char>_> is;
  streambuf local_228 [504];
  
  inipp::Ini<char>::Ini(&ini);
  std::__cxx11::string::string<std::allocator<char>>((string *)&expected,inifile,local_458);
  std::__cxx11::ostringstream::ostringstream(local_3c0);
  std::ifstream::ifstream((ifstream *)&is,(string *)&expected,_S_in);
  inipp::Ini<char>::parse(&ini,(basic_istream<char,_std::char_traits<char>_> *)&is);
  std::ifstream::~ifstream((ifstream *)&is);
  poVar2 = std::operator<<((ostream *)local_3c0,">>> ERRORS <<<");
  std::endl<char,std::char_traits<char>>(poVar2);
  p_Var3 = (_List_node_base *)&ini.errors;
  while (p_Var3 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var3 != (_List_node_base *)&ini.errors) {
    poVar2 = std::operator<<((ostream *)local_3c0,(string *)(p_Var3 + 1));
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  poVar2 = std::operator<<((ostream *)local_3c0,">>> GENERATE <<<");
  std::endl<char,std::char_traits<char>>(poVar2);
  inipp::Ini<char>::generate(&ini,(basic_ostream<char,_std::char_traits<char>_> *)local_3c0);
  poVar2 = std::operator<<((ostream *)local_3c0,">>> INTERPOLATE <<<");
  std::endl<char,std::char_traits<char>>(poVar2);
  inipp::Ini<char>::interpolate(&ini);
  inipp::Ini<char>::generate(&ini,(basic_ostream<char,_std::char_traits<char>_> *)local_3c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_3c0);
  std::__cxx11::string::~string((string *)&expected);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_458,expectedfile,&local_479);
  std::ifstream::ifstream((ifstream *)&is,(string *)local_458,_S_in);
  std::__cxx11::stringstream::stringstream((stringstream *)local_3c0);
  std::ostream::operator<<(local_3b0,local_228);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
  std::ifstream::~ifstream((ifstream *)&is);
  std::__cxx11::string::~string((string *)local_458);
  std::operator<<((ostream *)os,(string *)&actual);
  _Var1 = std::operator==(&actual,&expected);
  std::__cxx11::string::~string((string *)&expected);
  std::__cxx11::string::~string((string *)&actual);
  inipp::Ini<char>::~Ini(&ini);
  return _Var1;
}

Assistant:

static inline bool runtest(const char *inifile, const char *expectedfile, std::basic_ostream<CharT> & os) {
	Ini<CharT> ini;
	auto actual = test(inifile, ini);
	auto expected = read_all<CharT>(expectedfile);
	os << actual;
	return (actual == expected);
}